

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

reference * __thiscall
mjs::interpreter::impl::scope::lookup(reference *__return_storage_ptr__,scope *this,string *id)

{
  bool bVar1;
  object *this_00;
  scope *this_01;
  wstring_view local_38;
  
  this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->activation_,this->heap_);
  local_38 = string::view(id);
  bVar1 = object::has_property(this_00,&local_38);
  if (bVar1) {
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_38,(gc_heap *)&this->activation_);
    reference::reference(__return_storage_ptr__,(object_ptr *)&local_38,id);
  }
  else {
    if ((this->prev_).pos_ != 0) {
      this_01 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                          (&this->prev_,this->heap_);
      lookup(__return_storage_ptr__,this_01,id);
      return __return_storage_ptr__;
    }
    local_38._0_12_ = ZEXT812(0);
    reference::reference(__return_storage_ptr__,(object_ptr *)&local_38,id);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

reference lookup(const string& id) const {
            if (activation_.dereference(heap_).has_property(id.view())) {
                return reference{activation_.track(heap_), id};
            }
            if (prev_) {
                return prev_.dereference(heap_).lookup(id);
            } else {
                return reference{nullptr, id};
            }
        }